

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void __thiscall pybind11::module_::add_object(module_ *this,char *name,handle obj,bool overwrite)

{
  PyObject *pPVar1;
  int iVar2;
  long *plVar3;
  undefined7 in_register_00000009;
  size_type *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  allocator<char> local_21;
  
  if ((int)CONCAT71(in_register_00000009,overwrite) == 0) {
    iVar2 = PyObject_HasAttrString((this->super_object).super_handle.m_ptr,name);
    if (iVar2 == 1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,name,&local_21);
      std::operator+(&local_68,
                     "Error during initialization: multiple incompatible definitions with name \"",
                     &local_88);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
      local_48._M_dataplus._M_p = (pointer)*plVar3;
      psVar4 = (size_type *)(plVar3 + 2);
      if ((size_type *)local_48._M_dataplus._M_p == psVar4) {
        local_48.field_2._M_allocated_capacity = *psVar4;
        local_48.field_2._8_8_ = plVar3[3];
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      }
      else {
        local_48.field_2._M_allocated_capacity = *psVar4;
      }
      local_48._M_string_length = plVar3[1];
      *plVar3 = (long)psVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      pybind11_fail(&local_48);
    }
  }
  pPVar1 = (this->super_object).super_handle.m_ptr;
  if (obj.m_ptr != (PyObject *)0x0) {
    (obj.m_ptr)->ob_refcnt = (obj.m_ptr)->ob_refcnt + 1;
  }
  PyModule_AddObject(pPVar1,name,obj.m_ptr);
  return;
}

Assistant:

PYBIND11_NOINLINE void add_object(const char *name, handle obj, bool overwrite = false) {
        if (!overwrite && hasattr(*this, name))
            pybind11_fail("Error during initialization: multiple incompatible definitions with name \"" +
                    std::string(name) + "\"");

        PyModule_AddObject(ptr(), name, obj.inc_ref().ptr() /* steals a reference */);
    }